

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int typed_array_init(JSContext *ctx,JSValue obj,JSValue buffer,uint64_t offset,uint64_t len)

{
  JSValue v;
  uint uVar1;
  void *pvVar2;
  long in_RCX;
  JSContext *in_RSI;
  long in_R9;
  long in_stack_00000008;
  int size_log2;
  JSArrayBuffer *abuf;
  JSObject *pbuffer;
  JSObject *p;
  JSTypedArray *ta;
  list_head *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  JSValueUnion in_stack_ffffffffffffffa8;
  long lVar3;
  size_t in_stack_ffffffffffffffb0;
  int local_4;
  
  uVar1 = (uint)""[(int)((in_RSI->header).dummy2 - 0x15)];
  pvVar2 = js_malloc(in_RSI,in_stack_ffffffffffffffb0);
  if (pvVar2 == (void *)0x0) {
    v.tag = in_stack_ffffffffffffffb0;
    v.u.float64 = in_stack_ffffffffffffffa8.float64;
    JS_FreeValue((JSContext *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),v);
    local_4 = -1;
  }
  else {
    lVar3 = *(long *)(in_RCX + 0x30);
    *(JSContext **)((long)pvVar2 + 0x10) = in_RSI;
    *(long *)((long)pvVar2 + 0x18) = in_RCX;
    *(int *)((long)pvVar2 + 0x20) = (int)in_R9;
    *(int *)((long)pvVar2 + 0x24) = (int)(in_stack_00000008 << ((byte)uVar1 & 0x3f));
    list_add_tail((list_head *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
    *(void **)&in_RSI->binary_object_count = pvVar2;
    *(int *)&in_RSI->class_proto = (int)in_stack_00000008;
    in_RSI->array_shape = (JSShape *)(*(long *)(lVar3 + 8) + in_R9);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int typed_array_init(JSContext *ctx, JSValueConst obj,
                            JSValue buffer, uint64_t offset, uint64_t len)
{
    JSTypedArray *ta;
    JSObject *p, *pbuffer;
    JSArrayBuffer *abuf;
    int size_log2;

    p = JS_VALUE_GET_OBJ(obj);
    size_log2 = typed_array_size_log2(p->class_id);
    ta = js_malloc(ctx, sizeof(*ta));
    if (!ta) {
        JS_FreeValue(ctx, buffer);
        return -1;
    }
    pbuffer = JS_VALUE_GET_OBJ(buffer);
    abuf = pbuffer->u.array_buffer;
    ta->obj = p;
    ta->buffer = pbuffer;
    ta->offset = offset;
    ta->length = len << size_log2;
    list_add_tail(&ta->link, &abuf->array_list);
    p->u.typed_array = ta;
    p->u.array.count = len;
    p->u.array.u.ptr = abuf->data + offset;
    return 0;
}